

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_descriptor_heap_introspection_ssbo(Impl *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  uint uVar1;
  Id sizeId;
  Id IVar2;
  LoggingCallback p_Var3;
  void *pvVar4;
  Builder *pBVar5;
  Builder *this_00;
  int num;
  bool local_2129;
  allocator_type local_2105;
  Id var_id;
  iterator local_2100;
  undefined8 local_20f8;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_20f0;
  Id local_20d4;
  bool local_20cd;
  Id block_type_id;
  bool sync_val;
  Id inner_struct_array_type;
  iterator local_20c0;
  undefined8 local_20b8;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_20b0;
  Id local_2098;
  Id local_2094;
  Id inner_struct_type;
  Id u32_array_type;
  uint32_t elems;
  Id u32_type;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  int local_60;
  VulkanSRVBinding vulkan_binding;
  D3DBinding d3d_binding;
  Impl *this_local;
  
  vulkan_binding.offset_binding.bindless._4_4_ = get_remapping_stage(this->execution_model);
  vulkan_binding.offset_binding.descriptor_type._0_1_ = 0x10;
  memset((void *)((long)&cb + 4),0,0x30);
  uVar1 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[2])
                    (this->resource_mapping_iface,&vulkan_binding.offset_binding.bindless.use_heap,
                     (long)&cb + 4);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else if ((vulkan_binding.buffer_binding.bindless.heap_root_offset == 1) ||
          (vulkan_binding.buffer_binding.bindless.heap_root_offset == 0)) {
    if ((this->options).physical_address_descriptor_stride == 0) {
      p_Var3 = get_thread_log_callback();
      if (p_Var3 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: physical_address_descriptor_stride must be set.\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&elems,0x1000,"physical_address_descriptor_stride must be set.\n");
        pvVar4 = get_thread_log_callback_userdata();
        (*p_Var3)(pvVar4,Error,(char *)&elems);
      }
      this_local._7_1_ = false;
    }
    else {
      pBVar5 = builder(this);
      u32_array_type = spv::Builder::makeUintType(pBVar5,0x20);
      inner_struct_type = (this->options).physical_address_descriptor_stride;
      if (((this->options).instruction_instrumentation.enabled & 1U) == 0) {
        inner_struct_type = inner_struct_type << 1;
      }
      else {
        pBVar5 = builder(this);
        u32_array_type = spv::Builder::makeVectorType(pBVar5,u32_array_type,2);
      }
      pBVar5 = builder(this);
      IVar2 = u32_array_type;
      this_00 = builder(this);
      sizeId = spv::Builder::makeUintConstant(this_00,inner_struct_type,false);
      local_2094 = spv::Builder::makeArrayType(pBVar5,IVar2,sizeId,0);
      pBVar5 = builder(this);
      num = 4;
      if (((this->options).instruction_instrumentation.enabled & 1U) != 0) {
        num = 8;
      }
      spv::Builder::addDecoration(pBVar5,local_2094,DecorationArrayStride,num);
      inner_struct_array_type = local_2094;
      local_20c0 = &inner_struct_array_type;
      local_20b8 = 1;
      __l_00._M_len = 1;
      __l_00._M_array = local_20c0;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                (&local_20b0,__l_00,(allocator_type *)&sync_val);
      IVar2 = get_struct_type(this,&local_20b0,0,"DescriptorHeapRawPayload");
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_20b0)
      ;
      local_2098 = IVar2;
      pBVar5 = builder(this);
      spv::Builder::addMemberDecoration(pBVar5,local_2098,0,DecorationOffset,0);
      pBVar5 = builder(this);
      block_type_id = spv::Builder::makeRuntimeArray(pBVar5,local_2098);
      pBVar5 = builder(this);
      spv::Builder::addDecoration
                (pBVar5,block_type_id,DecorationArrayStride,
                 (this->options).physical_address_descriptor_stride << 3);
      local_2129 = false;
      if (((this->options).instruction_instrumentation.enabled & 1U) != 0) {
        local_2129 = (this->options).instruction_instrumentation.type ==
                     BufferSynchronizationValidation;
      }
      local_20cd = local_2129;
      var_id = block_type_id;
      local_2100 = &var_id;
      local_20f8 = 1;
      __l._M_len = 1;
      __l._M_array = local_2100;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                (&local_20f0,__l,&local_2105);
      IVar2 = get_struct_type(this,&local_20f0,0,"DescriptorHeapRobustnessSSBO");
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_20f0)
      ;
      local_20d4 = IVar2;
      pBVar5 = builder(this);
      spv::Builder::addDecoration(pBVar5,local_20d4,DecorationBlock,-1);
      pBVar5 = builder(this);
      spv::Builder::addMemberDecoration(pBVar5,local_20d4,0,DecorationOffset,0);
      if ((local_20cd & 1U) == 0) {
        pBVar5 = builder(this);
        spv::Builder::addMemberDecoration(pBVar5,local_20d4,0,DecorationNonWritable,-1);
        pBVar5 = builder(this);
        spv::Builder::addMemberDecoration(pBVar5,local_20d4,0,DecorationNonReadable,-1);
      }
      pBVar5 = builder(this);
      spv::Builder::addMemberName(pBVar5,local_20d4,0,"descriptors");
      IVar2 = create_variable(this,StorageClassStorageBuffer,local_20d4,"DescriptorHeapRobustness");
      pBVar5 = builder(this);
      spv::Builder::addDecoration(pBVar5,IVar2,DecorationDescriptorSet,cb._4_4_);
      pBVar5 = builder(this);
      spv::Builder::addDecoration(pBVar5,IVar2,DecorationBinding,local_60);
      (this->instrumentation).descriptor_heap_introspection_var_id = IVar2;
      if ((local_20cd & 1U) != 0) {
        pBVar5 = builder(this);
        IVar2 = spv::Builder::makeUintType(pBVar5,0x20);
        IVar2 = create_variable(this,StorageClassPrivate,IVar2,"InvocationID");
        (this->instrumentation).invocation_id_var_id = IVar2;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Dummy SSBO must be an SSBO.\n");
      fflush(_stderr);
    }
    else {
      snprintf((char *)&cb_1,0x1000,"Dummy SSBO must be an SSBO.\n");
      pvVar4 = get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,(char *)&cb_1);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::emit_descriptor_heap_introspection_ssbo()
{
	// We need to know the size of the descriptor heap. Rather than passing this
	// through a separate descriptor, we can just query the SSBO size of the
	// side-band SSBO. It is designed to have a size equal to the descriptor heap.
	// Somewhat hacky is that we can ask for a global heap of RTAS, which gets us this descriptor.
	D3DBinding d3d_binding = {
		get_remapping_stage(execution_model), DXIL::ResourceKind::RTAccelerationStructure, 0,
		UINT32_MAX, UINT32_MAX, UINT32_MAX, 0,
	};
	VulkanSRVBinding vulkan_binding = {};

	if (!resource_mapping_iface->remap_srv(d3d_binding, vulkan_binding))
		return false;

	if (vulkan_binding.buffer_binding.descriptor_type != VulkanDescriptorType::SSBO &&
	    vulkan_binding.buffer_binding.descriptor_type != VulkanDescriptorType::Identity)
	{
		LOGE("Dummy SSBO must be an SSBO.\n");
		return false;
	}

	if (options.physical_address_descriptor_stride == 0)
	{
		LOGE("physical_address_descriptor_stride must be set.\n");
		return false;
	}

	spv::Id u32_type = builder().makeUintType(32);
	uint32_t elems = options.physical_address_descriptor_stride;

	if (options.instruction_instrumentation.enabled)
		u32_type = builder().makeVectorType(u32_type, 2);
	else
		elems *= 2;

	spv::Id u32_array_type = builder().makeArrayType(u32_type, builder().makeUintConstant(elems), 0);
	builder().addDecoration(u32_array_type, spv::DecorationArrayStride,
	                        options.instruction_instrumentation.enabled ? 8 : 4);

	spv::Id inner_struct_type = get_struct_type({ u32_array_type }, 0, "DescriptorHeapRawPayload");
	builder().addMemberDecoration(inner_struct_type, 0, spv::DecorationOffset, 0);

	spv::Id inner_struct_array_type = builder().makeRuntimeArray(inner_struct_type);
	builder().addDecoration(inner_struct_array_type, spv::DecorationArrayStride,
	                        8u * options.physical_address_descriptor_stride);

	bool sync_val =
		options.instruction_instrumentation.enabled &&
		options.instruction_instrumentation.type == InstructionInstrumentationType::BufferSynchronizationValidation;

	spv::Id block_type_id = get_struct_type({ inner_struct_array_type }, 0, "DescriptorHeapRobustnessSSBO");
	builder().addDecoration(block_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(block_type_id, 0, spv::DecorationOffset, 0);
	if (!sync_val)
	{
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonWritable);
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonReadable);
	}
	builder().addMemberName(block_type_id, 0, "descriptors");
	spv::Id var_id = create_variable(spv::StorageClassStorageBuffer, block_type_id, "DescriptorHeapRobustness");

	builder().addDecoration(var_id, spv::DecorationDescriptorSet, vulkan_binding.buffer_binding.descriptor_set);
	builder().addDecoration(var_id, spv::DecorationBinding, vulkan_binding.buffer_binding.binding);

	// Take OpArrayLength of this variable's first member and we have it.
	instrumentation.descriptor_heap_introspection_var_id = var_id;

	if (sync_val)
	{
		instrumentation.invocation_id_var_id =
			create_variable(spv::StorageClassPrivate, builder().makeUintType(32), "InvocationID");
	}

	return true;
}